

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O3

size_t FSE_buildCTable_wksp
                 (FSE_CTable *ct,short *normalizedCounter,uint maxSymbolValue,uint tableLog,
                 void *workSpace,size_t wkspSize)

{
  ushort *puVar1;
  ushort uVar2;
  short sVar3;
  short sVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  FSE_CTable FVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  bool bVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  
  uVar21 = 1 << ((byte)tableLog & 0x1f);
  uVar20 = (ulong)uVar21;
  uVar13 = 1;
  if (tableLog != 0) {
    uVar13 = (ulong)(uVar21 >> 1);
  }
  if (((ulong)workSpace & 1) != 0) {
    __assert_fail("((size_t)workSpace & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                  ,0x56,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar18 = (ulong)(maxSymbolValue + 2);
  if (wkspSize < ((1L << ((byte)tableLog & 0x3f)) + uVar18 & 0xfffffffffffffffe) * 2 + 8) {
    return 0xffffffffffffffd4;
  }
  *(short *)ct = (short)tableLog;
  *(short *)((long)ct + 2) = (short)maxSymbolValue;
  if (0xf < tableLog) {
    __assert_fail("tableLog < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                  ,0x5b,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar14 = uVar21 - 1;
  iVar16 = (uVar21 >> 3) + (uVar21 >> 1) + 3;
  *(undefined2 *)workSpace = 0;
  uVar11 = maxSymbolValue + 1;
  sVar4 = (short)uVar21;
  if (uVar11 == 0) {
    *(short *)workSpace = sVar4 + 1;
  }
  else {
    uVar23 = uVar14;
    uVar12 = 0;
    do {
      uVar10 = (ulong)uVar12;
      uVar2 = normalizedCounter[uVar10];
      if (uVar2 == 0xffff) {
        *(short *)((long)workSpace + (ulong)(uVar12 + 1) * 2) =
             *(short *)((long)workSpace + uVar10 * 2) + 1;
        uVar10 = (ulong)uVar23;
        uVar23 = uVar23 - 1;
        *(char *)((long)workSpace + uVar10 + uVar18 * 2) = (char)uVar12;
      }
      else {
        if ((short)uVar2 < 0) {
          __assert_fail("normalizedCounter[u-1] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0x6c,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        puVar1 = (ushort *)((long)workSpace + uVar10 * 2);
        uVar9 = *puVar1;
        *(ushort *)((long)workSpace + (ulong)(uVar12 + 1) * 2) = uVar2 + *puVar1;
        if (CARRY2(uVar2,uVar9)) {
          __assert_fail("cumul[u] >= cumul[u-1]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0x6e,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
      uVar17 = uVar12 + 2;
      uVar12 = uVar12 + 1;
    } while (uVar17 <= uVar11);
    *(short *)((long)workSpace + (ulong)uVar11 * 2) = sVar4 + 1;
    auVar8 = _DAT_00245110;
    auVar7 = _DAT_00245100;
    if (uVar23 != uVar14) {
      if (uVar11 != 0) {
        uVar10 = 0;
        uVar12 = 0;
        do {
          sVar3 = normalizedCounter[uVar10];
          if (0 < sVar3) {
            iVar24 = 0;
            do {
              *(char *)((long)workSpace + (ulong)uVar12 + uVar18 * 2) = (char)uVar10;
              do {
                uVar12 = uVar12 + iVar16 & uVar14;
              } while (uVar23 < uVar12);
              iVar24 = iVar24 + 1;
            } while (iVar24 != sVar3);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar11);
        if (uVar12 != 0) {
          __assert_fail("position==0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0xa6,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
      }
      goto LAB_00214e78;
    }
    lVar5 = uVar20 + uVar18 * 2;
    if (uVar11 != 0) {
      lVar25 = 0;
      lVar22 = 0;
      uVar11 = 0;
      do {
        uVar2 = normalizedCounter[uVar11];
        *(long *)((long)workSpace + lVar25 + lVar5) = lVar22;
        if (8 < (long)(short)uVar2) {
          uVar9 = 0x10;
          if (0x10 < uVar2) {
            uVar9 = uVar2;
          }
          lVar6 = lVar25 + lVar5;
          uVar19 = (ulong)uVar9 - 9;
          auVar29._8_4_ = (int)uVar19;
          auVar29._0_8_ = uVar19;
          auVar29._12_4_ = (int)(uVar19 >> 0x20);
          auVar27._0_8_ = uVar19 >> 3;
          auVar27._8_8_ = auVar29._8_8_ >> 3;
          auVar27 = auVar27 ^ auVar8;
          uVar10 = 0;
          do {
            auVar28._8_4_ = (int)uVar10;
            auVar28._0_8_ = uVar10;
            auVar28._12_4_ = (int)(uVar10 >> 0x20);
            auVar29 = (auVar28 | auVar7) ^ auVar8;
            if ((bool)(~(auVar27._4_4_ < auVar29._4_4_ ||
                        auVar27._0_4_ < auVar29._0_4_ && auVar29._4_4_ == auVar27._4_4_) & 1)) {
              *(long *)((long)workSpace + uVar10 * 8 + lVar6 + 8) = lVar22;
            }
            if (auVar29._12_4_ <= auVar27._12_4_ &&
                (auVar29._8_4_ <= auVar27._8_4_ || auVar29._12_4_ != auVar27._12_4_)) {
              *(long *)((long)workSpace + uVar10 * 8 + lVar6 + 0x10) = lVar22;
            }
            uVar10 = uVar10 + 2;
          } while (((uVar19 >> 3) + 2 & 0xfffffffffffffffe) != uVar10);
        }
        if ((short)uVar2 < 0) {
          __assert_fail("n>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0x84,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        lVar25 = lVar25 + (short)uVar2;
        lVar22 = lVar22 + 0x101010101010101;
        bVar26 = uVar11 != maxSymbolValue;
        uVar11 = uVar11 + 1;
      } while (bVar26);
    }
  }
  lVar5 = uVar20 + uVar18 * 2;
  if ((uVar21 & 1) != 0) {
    __assert_fail("tableSize % unroll == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                  ,0x8f,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
  uVar10 = 0;
  uVar11 = 0;
  do {
    *(undefined1 *)((long)workSpace + (ulong)(uVar11 & uVar14) + uVar18 * 2) =
         *(undefined1 *)((long)workSpace + uVar10 + lVar5);
    *(undefined1 *)((long)workSpace + (ulong)(uVar11 + iVar16 & uVar14) + uVar18 * 2) =
         *(undefined1 *)((long)workSpace + uVar10 + lVar5 + 1);
    uVar11 = uVar11 + iVar16 * 2 & uVar14;
    uVar10 = uVar10 + 2;
  } while (uVar10 < uVar20);
  if (uVar11 != 0) {
    __assert_fail("position == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                  ,0x98,
                  "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                 );
  }
LAB_00214e78:
  uVar10 = 0;
  do {
    uVar19 = (ulong)*(byte *)((long)workSpace + uVar10 + uVar18 * 2);
    uVar2 = *(ushort *)((long)workSpace + uVar19 * 2);
    *(ushort *)((long)workSpace + uVar19 * 2) = uVar2 + 1;
    *(short *)((long)ct + (ulong)uVar2 * 2 + 4) = sVar4 + (short)uVar10;
    uVar10 = uVar10 + 1;
  } while (uVar20 != uVar10);
  FVar15 = tableLog * 0x10000 - uVar21;
  uVar21 = 0;
  iVar16 = 0;
  do {
    uVar20 = (ulong)uVar21;
    uVar2 = normalizedCounter[uVar20];
    if ((uVar2 == 0xffff) || (uVar2 == 1)) {
      ct[uVar13 + uVar20 * 2 + 2] = FVar15;
      if (iVar16 < 0) {
        __assert_fail("total <= INT_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                      ,0xbd,
                      "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                     );
      }
      ct[uVar13 + uVar20 * 2 + 1] = iVar16 - 1;
      iVar16 = iVar16 + 1;
    }
    else {
      uVar11 = (uint)uVar2;
      if (uVar11 == 0) {
        ct[uVar13 + uVar20 * 2 + 2] = FVar15 + 0x10000;
      }
      else {
        if ((short)uVar2 < 2) {
          __assert_fail("normalizedCounter[s] > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/fse_compress.c"
                        ,0xc2,
                        "size_t FSE_buildCTable_wksp(FSE_CTable *, const short *, unsigned int, unsigned int, void *, size_t)"
                       );
        }
        uVar14 = uVar2 - 1 & 0xffff;
        iVar24 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> iVar24 == 0; iVar24 = iVar24 + -1) {
          }
        }
        ct[uVar13 + uVar20 * 2 + 2] =
             (tableLog - iVar24) * 0x10000 - (uVar11 << ((byte)(tableLog - iVar24) & 0x1f));
        ct[uVar13 + uVar20 * 2 + 1] = iVar16 - uVar11;
        iVar16 = iVar16 + (uint)uVar2;
      }
    }
    uVar21 = uVar21 + 1;
  } while (uVar21 <= maxSymbolValue);
  return 0;
}

Assistant:

size_t FSE_buildCTable_wksp(FSE_CTable* ct,
                      const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                            void* workSpace, size_t wkspSize)
{
    U32 const tableSize = 1 << tableLog;
    U32 const tableMask = tableSize - 1;
    void* const ptr = ct;
    U16* const tableU16 = ( (U16*) ptr) + 2;
    void* const FSCT = ((U32*)ptr) + 1 /* header */ + (tableLog ? tableSize>>1 : 1) ;
    FSE_symbolCompressionTransform* const symbolTT = (FSE_symbolCompressionTransform*) (FSCT);
    U32 const step = FSE_TABLESTEP(tableSize);
    U32 const maxSV1 = maxSymbolValue+1;

    U16* cumul = (U16*)workSpace;   /* size = maxSV1 */
    FSE_FUNCTION_TYPE* const tableSymbol = (FSE_FUNCTION_TYPE*)(cumul + (maxSV1+1));  /* size = tableSize */

    U32 highThreshold = tableSize-1;

    assert(((size_t)workSpace & 1) == 0);  /* Must be 2 bytes-aligned */
    if (FSE_BUILD_CTABLE_WORKSPACE_SIZE(maxSymbolValue, tableLog) > wkspSize) return ERROR(tableLog_tooLarge);
    /* CTable header */
    tableU16[-2] = (U16) tableLog;
    tableU16[-1] = (U16) maxSymbolValue;
    assert(tableLog < 16);   /* required for threshold strategy to work */

    /* For explanations on how to distribute symbol values over the table :
     * https://fastcompression.blogspot.fr/2014/02/fse-distributing-symbol-values.html */

     #ifdef __clang_analyzer__
     ZSTD_memset(tableSymbol, 0, sizeof(*tableSymbol) * tableSize);   /* useless initialization, just to keep scan-build happy */
     #endif

    /* symbol start positions */
    {   U32 u;
        cumul[0] = 0;
        for (u=1; u <= maxSV1; u++) {
            if (normalizedCounter[u-1]==-1) {  /* Low proba symbol */
                cumul[u] = cumul[u-1] + 1;
                tableSymbol[highThreshold--] = (FSE_FUNCTION_TYPE)(u-1);
            } else {
                assert(normalizedCounter[u-1] >= 0);
                cumul[u] = cumul[u-1] + (U16)normalizedCounter[u-1];
                assert(cumul[u] >= cumul[u-1]);  /* no overflow */
        }   }
        cumul[maxSV1] = (U16)(tableSize+1);
    }

    /* Spread symbols */
    if (highThreshold == tableSize - 1) {
        /* Case for no low prob count symbols. Lay down 8 bytes at a time
         * to reduce branch misses since we are operating on a small block
         */
        BYTE* const spread = tableSymbol + tableSize; /* size = tableSize + 8 (may write beyond tableSize) */
        {   U64 const add = 0x0101010101010101ull;
            size_t pos = 0;
            U64 sv = 0;
            U32 s;
            for (s=0; s<maxSV1; ++s, sv += add) {
                int i;
                int const n = normalizedCounter[s];
                MEM_write64(spread + pos, sv);
                for (i = 8; i < n; i += 8) {
                    MEM_write64(spread + pos + i, sv);
                }
                assert(n>=0);
                pos += (size_t)n;
            }
        }
        /* Spread symbols across the table. Lack of lowprob symbols means that
         * we don't need variable sized inner loop, so we can unroll the loop and
         * reduce branch misses.
         */
        {   size_t position = 0;
            size_t s;
            size_t const unroll = 2; /* Experimentally determined optimal unroll */
            assert(tableSize % unroll == 0); /* FSE_MIN_TABLELOG is 5 */
            for (s = 0; s < (size_t)tableSize; s += unroll) {
                size_t u;
                for (u = 0; u < unroll; ++u) {
                    size_t const uPosition = (position + (u * step)) & tableMask;
                    tableSymbol[uPosition] = spread[s + u];
                }
                position = (position + (unroll * step)) & tableMask;
            }
            assert(position == 0);   /* Must have initialized all positions */
        }
    } else {
        U32 position = 0;
        U32 symbol;
        for (symbol=0; symbol<maxSV1; symbol++) {
            int nbOccurrences;
            int const freq = normalizedCounter[symbol];
            for (nbOccurrences=0; nbOccurrences<freq; nbOccurrences++) {
                tableSymbol[position] = (FSE_FUNCTION_TYPE)symbol;
                position = (position + step) & tableMask;
                while (position > highThreshold)
                    position = (position + step) & tableMask;   /* Low proba area */
        }   }
        assert(position==0);  /* Must have initialized all positions */
    }

    /* Build table */
    {   U32 u; for (u=0; u<tableSize; u++) {
        FSE_FUNCTION_TYPE s = tableSymbol[u];   /* note : static analyzer may not understand tableSymbol is properly initialized */
        tableU16[cumul[s]++] = (U16) (tableSize+u);   /* TableU16 : sorted by symbol order; gives next state value */
    }   }

    /* Build Symbol Transformation Table */
    {   unsigned total = 0;
        unsigned s;
        for (s=0; s<=maxSymbolValue; s++) {
            switch (normalizedCounter[s])
            {
            case  0:
                /* filling nonetheless, for compatibility with FSE_getMaxNbBits() */
                symbolTT[s].deltaNbBits = ((tableLog+1) << 16) - (1<<tableLog);
                break;

            case -1:
            case  1:
                symbolTT[s].deltaNbBits = (tableLog << 16) - (1<<tableLog);
                assert(total <= INT_MAX);
                symbolTT[s].deltaFindState = (int)(total - 1);
                total ++;
                break;
            default :
                assert(normalizedCounter[s] > 1);
                {   U32 const maxBitsOut = tableLog - ZSTD_highbit32 ((U32)normalizedCounter[s]-1);
                    U32 const minStatePlus = (U32)normalizedCounter[s] << maxBitsOut;
                    symbolTT[s].deltaNbBits = (maxBitsOut << 16) - minStatePlus;
                    symbolTT[s].deltaFindState = (int)(total - (unsigned)normalizedCounter[s]);
                    total +=  (unsigned)normalizedCounter[s];
    }   }   }   }

#if 0  /* debug : symbol costs */
    DEBUGLOG(5, "\n --- table statistics : ");
    {   U32 symbol;
        for (symbol=0; symbol<=maxSymbolValue; symbol++) {
            DEBUGLOG(5, "%3u: w=%3i,   maxBits=%u, fracBits=%.2f",
                symbol, normalizedCounter[symbol],
                FSE_getMaxNbBits(symbolTT, symbol),
                (double)FSE_bitCost(symbolTT, tableLog, symbol, 8) / 256);
    }   }
#endif

    return 0;
}